

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  undefined8 *puVar15;
  float *pfVar16;
  byte bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  uchar scanlineheader [4];
  char header [66];
  char buffer [128];
  undefined1 local_1b5;
  undefined4 local_1b4;
  char local_1ad;
  undefined4 local_1ac;
  void *local_1a8;
  void *local_1a0;
  long local_198;
  long local_190;
  ulong local_188;
  uint local_17c;
  uint local_178;
  int local_174;
  uint local_170;
  uint local_16c;
  char local_168 [4];
  char local_164 [4];
  long local_160;
  long local_158;
  ulong local_150;
  long local_148;
  float *local_140;
  ulong local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  void *local_110;
  undefined8 local_108 [8];
  undefined2 local_c8;
  char local_b8 [136];
  
  bVar17 = 0;
  iVar2 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    local_140 = data;
    pvVar3 = malloc((ulong)(uint)(x * 4));
    pcVar13 = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    puVar15 = local_108;
    for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar15 = *(undefined8 *)pcVar13;
      pcVar13 = pcVar13 + ((ulong)bVar17 * -2 + 1) * 8;
      puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
    }
    local_c8 = 10;
    (*s->func)(s->context,local_108,0x41);
    iVar2 = sprintf(local_b8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    uVar9 = 0;
    (*s->func)(s->context,local_b8,iVar2);
    local_174 = comp * x;
    local_178 = (uint)x >> 8;
    local_17c = x - 0x8000;
    uVar11 = comp - 3;
    uVar14 = (ulong)(uint)x;
    local_158 = uVar14 - 3;
    local_160 = (long)comp << 2;
    local_128 = -uVar14;
    local_120 = (ulong)(uint)(x * 3) + (long)pvVar3;
    local_118 = (ulong)(uint)(x * 2) + (long)pvVar3;
    local_130 = (long)pvVar3 + uVar14;
    local_148 = (long)pvVar3 + 2;
    local_188 = (ulong)(uint)x;
    local_170 = y;
    local_16c = uVar11;
    local_150 = uVar14;
    local_110 = pvVar3;
    do {
      uVar8 = ~(uint)uVar9 + local_170;
      if (stbi__flip_vertically_on_write == 0) {
        uVar8 = (uint)uVar9;
      }
      pfVar16 = local_140 + (int)(uVar8 * local_174);
      local_1ac = CONCAT13((char)local_188,CONCAT12((char)local_178,0x202));
      uVar10 = uVar14;
      local_138 = uVar9;
      if (local_17c < 0xffff8008) {
        do {
          if (uVar11 < 2) {
            fVar18 = pfVar16[2];
            fVar20 = pfVar16[1];
            fVar21 = *pfVar16;
          }
          else {
            fVar18 = *pfVar16;
            fVar20 = fVar18;
            fVar21 = fVar18;
          }
          fVar19 = fVar20;
          if (fVar20 <= fVar18) {
            fVar19 = fVar18;
          }
          fVar22 = fVar21;
          if (fVar21 <= fVar19) {
            fVar22 = fVar19;
          }
          if (1e-32 <= fVar22) {
            local_1a0 = (void *)CONCAT44(local_1a0._4_4_,fVar18);
            local_190 = CONCAT44(local_190._4_4_,fVar20);
            local_1a8 = (void *)CONCAT44(local_1a8._4_4_,fVar21);
            local_198 = CONCAT44(local_198._4_4_,fVar22);
            fVar18 = frexpf(fVar22,(int *)local_168);
            fVar18 = (fVar18 * 256.0) / (float)local_198;
            local_1b4 = CONCAT13(local_168[0] + -0x80,
                                 CONCAT12((char)(int)(local_1a0._0_4_ * fVar18),
                                          CONCAT11((char)(int)((float)local_190 * fVar18),
                                                   (char)(int)(local_1a8._0_4_ * fVar18))));
          }
          else {
            local_1b4 = 0;
          }
          (*s->func)(s->context,&local_1b4,4);
          pfVar16 = (float *)((long)pfVar16 + local_160);
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      else {
        lVar5 = 0;
        do {
          if (uVar11 < 2) {
            fVar18 = pfVar16[2];
            fVar20 = pfVar16[1];
            fVar21 = *pfVar16;
          }
          else {
            fVar18 = *pfVar16;
            fVar20 = fVar18;
            fVar21 = fVar18;
          }
          fVar19 = fVar20;
          if (fVar20 <= fVar18) {
            fVar19 = fVar18;
          }
          fVar22 = fVar21;
          if (fVar21 <= fVar19) {
            fVar22 = fVar19;
          }
          if (1e-32 <= fVar22) {
            local_1a0 = (void *)CONCAT44(local_1a0._4_4_,fVar18);
            local_190 = CONCAT44(local_190._4_4_,fVar20);
            local_1a8 = (void *)CONCAT44(local_1a8._4_4_,fVar21);
            local_198 = CONCAT44(local_198._4_4_,fVar22);
            fVar18 = frexpf(fVar22,(int *)local_164);
            fVar18 = (fVar18 * 256.0) / (float)local_198;
            local_1b4 = CONCAT13(local_164[0] + -0x80,
                                 CONCAT12((char)(int)(local_1a0._0_4_ * fVar18),
                                          CONCAT11((char)(int)((float)local_190 * fVar18),
                                                   (char)(int)(local_1a8._0_4_ * fVar18))));
          }
          else {
            local_1b4 = 0;
          }
          *(undefined1 *)((long)pvVar3 + lVar5) = (undefined1)local_1b4;
          *(undefined1 *)(local_130 + lVar5) = local_1b4._1_1_;
          *(undefined1 *)(local_118 + lVar5) = local_1b4._2_1_;
          *(undefined1 *)(local_120 + lVar5) = local_1b4._3_1_;
          lVar5 = lVar5 + 1;
          pfVar16 = (float *)((long)pfVar16 + local_160);
        } while (local_128 + lVar5 != 0);
        (*s->func)(s->context,&local_1ac,4);
        lVar4 = 0;
        lVar5 = local_148;
        local_1a8 = pvVar3;
        do {
          pvVar3 = (void *)(lVar4 * uVar14 + (long)pvVar3);
          iVar2 = 0;
          local_1a0 = pvVar3;
          local_198 = lVar4;
          local_190 = lVar5;
          do {
            iVar12 = (int)local_188;
            iVar7 = iVar12;
            if (iVar2 + 2 < iVar12) {
              lVar5 = (long)iVar2 + -1;
              iVar6 = iVar2;
              do {
                cVar1 = *(char *)(local_190 + -1 + lVar5);
                if ((cVar1 == *(char *)(local_190 + lVar5)) &&
                   (iVar7 = iVar6, cVar1 == *(char *)(local_190 + 1 + lVar5))) break;
                iVar6 = iVar6 + 1;
                lVar5 = lVar5 + 1;
                iVar7 = iVar12;
              } while (lVar5 < local_158);
            }
            for (; iVar2 < iVar7; iVar2 = iVar2 + iVar12) {
              iVar12 = iVar7 - iVar2;
              if (0x7f < iVar12) {
                iVar12 = 0x80;
              }
              local_1b5 = (undefined1)iVar12;
              (*s->func)(s->context,&local_1b5,1);
              (*s->func)(s->context,(void *)((long)pvVar3 + (long)iVar2),iVar12);
              pvVar3 = local_1a0;
            }
            iVar12 = (int)local_188;
            if (iVar7 + 2 < iVar12) {
              lVar5 = (long)iVar7;
              iVar6 = iVar7 + 1;
              if (iVar7 + 1 < iVar12) {
                iVar6 = iVar12;
              }
              do {
                if (*(char *)((long)local_1a8 + lVar5) != *(char *)((long)pvVar3 + (long)iVar2)) {
                  iVar6 = (int)lVar5;
                  break;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < (long)local_150);
              if (iVar2 < iVar6) {
                do {
                  iVar7 = iVar6 - iVar2;
                  if (0x7e < iVar6 - iVar2) {
                    iVar7 = 0x7f;
                  }
                  local_1b5 = *(undefined1 *)((long)pvVar3 + (long)iVar2);
                  local_1ad = (char)iVar7 + -0x80;
                  (*s->func)(s->context,&local_1ad,1);
                  (*s->func)(s->context,&local_1b5,1);
                  iVar2 = iVar2 + iVar7;
                  pvVar3 = local_1a0;
                } while (iVar2 < iVar6);
              }
            }
          } while (iVar2 < (int)local_188);
          lVar4 = local_198 + 1;
          lVar5 = local_190 + local_150;
          local_1a8 = (void *)((long)local_1a8 + local_150);
          uVar14 = local_150;
          pvVar3 = local_110;
          uVar11 = local_16c;
        } while (lVar4 != 4);
      }
      uVar8 = (int)local_138 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != local_170);
    free(pvVar3);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef STBI_MSC_SECURE_CRT
      len = sprintf_s(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}